

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O3

int Mop_ManMergeDist1Pairs
              (Mop_Man_t *p,Vec_Int_t *vGroup,Vec_Int_t *vGroupPrev,Vec_Int_t *vStats,int nLimit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  word *pwVar6;
  Vec_Int_t *pVVar7;
  word *pwVar8;
  bool bVar9;
  int iVar10;
  Vec_Int_t *vPairs;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  
  vPairs = Mop_ManFindDist1Pairs(p,vGroup);
  __ptr = Mop_ManCompatiblePairs(vPairs,vGroup->nSize);
  iVar1 = vGroup->nSize;
  iVar2 = vGroupPrev->nSize;
  iVar3 = __ptr->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar10 = iVar3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar10;
  if (iVar10 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    piVar11 = (int *)malloc((long)iVar10 << 2);
  }
  p_00->pArray = piVar11;
  if (iVar3 < 2) {
LAB_003375ef:
    if (piVar11 != (int *)0x0) {
LAB_003375f4:
      free(piVar11);
    }
    free(p_00);
    if (0 < iVar3) {
      uVar15 = vGroup->nSize;
      if ((int)uVar15 < 1) {
        uVar12 = 0;
      }
      else {
        piVar11 = vGroup->pArray;
        lVar22 = 0;
        uVar12 = 0;
        do {
          iVar3 = piVar11[lVar22];
          if (iVar3 != -1) {
            if (((int)uVar12 < 0) || (uVar15 <= uVar12)) {
LAB_00337739:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar17 = (ulong)uVar12;
            uVar12 = uVar12 + 1;
            piVar11[uVar17] = iVar3;
            uVar15 = vGroup->nSize;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < (int)uVar15);
      }
      if ((int)uVar15 < (int)uVar12) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      vGroup->nSize = uVar12;
    }
    if (vPairs->pArray != (int *)0x0) {
      free(vPairs->pArray);
    }
    free(vPairs);
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    return (iVar2 + iVar1) - (vGroup->nSize + vGroupPrev->nSize);
  }
  piVar11 = __ptr->pArray;
  lVar22 = 0;
  while( true ) {
    iVar10 = piVar11[lVar22];
    lVar18 = (long)iVar10;
    if ((lVar18 < 0) || (vGroup->nSize <= iVar10)) break;
    uVar15 = p->nWordsIn;
    uVar17 = (ulong)uVar15;
    uVar12 = vGroup->pArray[lVar18] * uVar15;
    if ((int)uVar12 < 0) {
LAB_003376dc:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    uVar13 = p->vWordsIn->nSize;
    if ((int)uVar13 <= (int)uVar12) goto LAB_003376dc;
    uVar20 = piVar11[lVar22 + 1];
    if (((int)uVar20 < 0) || ((uint)vGroup->nSize <= uVar20)) break;
    uVar19 = vGroup->pArray[uVar20] * uVar15;
    if (((int)uVar19 < 0) || (uVar13 <= uVar19)) goto LAB_003376dc;
    if ((int)uVar15 < 1) {
LAB_003376fb:
      __assert_fail("Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                    ,0x1ef,
                    "int Mop_ManMergeDist1Pairs(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    pwVar6 = p->vWordsIn->pArray;
    bVar9 = true;
    uVar21 = 0;
    do {
      while( true ) {
        uVar16 = uVar21 + 1;
        if (pwVar6[uVar12 + uVar21] != pwVar6[uVar19 + uVar21]) break;
        uVar21 = uVar16;
        if (uVar16 == uVar17) {
          if (bVar9) goto LAB_003376fb;
          goto LAB_003373a3;
        }
      }
      uVar21 = pwVar6[uVar19 + uVar21] ^ pwVar6[uVar12 + uVar21];
      if (((((uVar21 >> 1 ^ uVar21) & 0x5555555555555555) != 0) ||
          (uVar21 = uVar21 & 0x5555555555555555 & uVar21 >> 1, (bool)~bVar9 || uVar21 == 0)) ||
         (uVar21 = (uVar21 >> 2 & 0x3333333333333333) + (uVar21 & 0x3333333333333333),
         1 < (byte)(((uVar21 >> 4) + uVar21 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)))
      goto LAB_003376fb;
      bVar9 = false;
      uVar21 = uVar16;
    } while (uVar16 != uVar17);
LAB_003373a3:
    uVar15 = 0;
    uVar21 = 0;
LAB_003373a7:
    uVar16 = (ulong)uVar15;
    lVar14 = 0;
LAB_003373b7:
    if (((pwVar6[uVar19 + uVar21] ^ pwVar6[uVar12 + uVar21]) >> ((byte)lVar14 & 0x3f) & 3) == 0)
    goto code_r0x003373c3;
    if (((int)uVar16 < 0) || (vStats->nSize <= (int)uVar16)) break;
    if (nLimit < vStats->pArray[uVar16]) goto LAB_00337558;
    Vec_IntPush(p_00,iVar10);
    Vec_IntPush(p_00,uVar20);
    pVVar7 = p->vFree;
    if (pVVar7->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    uVar15 = pVVar7->nSize - 1;
    pVVar7->nSize = uVar15;
    iVar4 = pVVar7->pArray[uVar15];
    uVar15 = p->nWordsIn;
    uVar13 = uVar15 * iVar4;
    if (((int)uVar13 < 0) || (p->vWordsIn->nSize <= (int)uVar13)) goto LAB_003376dc;
    if (0 < (int)uVar15) {
      pwVar8 = p->vWordsIn->pArray;
      uVar17 = 0;
      do {
        pwVar8[uVar13 + uVar17] = pwVar6[uVar19 + uVar17] & pwVar6[uVar12 + uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar15 != uVar17);
    }
    iVar5 = p->nWordsOut;
    uVar15 = iVar5 * iVar4;
    if ((int)uVar15 < 0) goto LAB_003376dc;
    uVar12 = p->vWordsOut->nSize;
    if ((int)uVar12 <= (int)uVar15) goto LAB_003376dc;
    if (vGroup->nSize <= iVar10) break;
    uVar13 = vGroup->pArray[lVar18] * iVar5;
    if (((int)uVar13 < 0) || (uVar12 <= uVar13)) goto LAB_003376dc;
    if (vGroup->nSize <= (int)uVar20) break;
    uVar20 = vGroup->pArray[uVar20] * iVar5;
    if (((int)uVar20 < 0) || (uVar12 <= uVar20)) goto LAB_003376dc;
    pwVar6 = p->vWordsOut->pArray;
    iVar10 = bcmp(pwVar6 + uVar13,pwVar6 + uVar20,(long)iVar5 * 8);
    if (iVar10 != 0) {
      __assert_fail("!memcmp(pCube1, pCube2, sizeof(word)*p->nWordsOut)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                    ,0x201,
                    "int Mop_ManMergeDist1Pairs(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (0 < iVar5) {
      lVar18 = 0;
      do {
        pwVar6[(ulong)uVar15 + lVar18] = (pwVar6 + uVar13)[lVar18];
        lVar18 = lVar18 + 1;
      } while (iVar5 != lVar18);
    }
    Vec_IntPush(vGroupPrev,iVar4);
LAB_00337558:
    lVar22 = lVar22 + 2;
    if (iVar3 <= (int)((uint)lVar22 | 1)) {
      iVar10 = p_00->nSize;
      piVar11 = p_00->pArray;
      if ((long)iVar10 < 1) goto LAB_003375ef;
      lVar22 = 0;
      do {
        iVar4 = piVar11[lVar22];
        lVar18 = (long)iVar4;
        if ((lVar18 < 0) || (vGroup->nSize <= iVar4)) goto LAB_003376bd;
        if (vGroup->pArray[lVar18] != -1) {
          Vec_IntPush(p->vFree,vGroup->pArray[lVar18]);
          if (vGroup->nSize <= iVar4) goto LAB_00337739;
          vGroup->pArray[lVar18] = -1;
        }
        lVar22 = lVar22 + 1;
      } while (iVar10 != lVar22);
      goto LAB_003375f4;
    }
  }
LAB_003376bd:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
code_r0x003373c3:
  uVar16 = uVar16 + 1;
  lVar14 = lVar14 + 2;
  if (lVar14 == 0x40) goto code_r0x003373d0;
  goto LAB_003373b7;
code_r0x003373d0:
  uVar21 = uVar21 + 1;
  uVar15 = uVar15 + 0x20;
  if (uVar21 == uVar17) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                  ,0x15a,"int Mop_ManFindDiffVar(word *, word *, int)");
  }
  goto LAB_003373a7;
}

Assistant:

int Mop_ManMergeDist1Pairs( Mop_Man_t * p, Vec_Int_t * vGroup, Vec_Int_t * vGroupPrev, Vec_Int_t * vStats, int nLimit )
{
    Vec_Int_t * vPairs    = Mop_ManFindDist1Pairs( p, vGroup );
    Vec_Int_t * vPairsNew = Mop_ManCompatiblePairs( vPairs, Vec_IntSize(vGroup) );
    int nCubes = Vec_IntSize(vGroup) + Vec_IntSize(vGroupPrev);
    int w, i, c1, c2, iCubeNew, iVar;
    // move cubes to the previous group
    word * pCube, * pCube1, * pCube2;
    Vec_Int_t * vToFree = Vec_IntAlloc( Vec_IntSize(vPairsNew) );
    Vec_IntForEachEntryDouble( vPairsNew, c1, c2, i )
    {
        pCube1 = Mop_ManCubeIn( p, Vec_IntEntry(vGroup, c1) );
        pCube2 = Mop_ManCubeIn( p, Vec_IntEntry(vGroup, c2) );
        assert( Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) );

        // skip those cubes that have frequently appearing variables
        iVar = Mop_ManFindDiffVar( pCube1, pCube2, p->nWordsIn );
        if ( Vec_IntEntry( vStats, iVar ) > nLimit )
            continue;
        Vec_IntPush( vToFree, c1 );
        Vec_IntPush( vToFree, c2 );

        iCubeNew  = Vec_IntPop( p->vFree );
        pCube  = Mop_ManCubeIn( p, iCubeNew );
        for ( w = 0; w < p->nWordsIn; w++ )
            pCube[w] = pCube1[w] & pCube2[w];

        pCube  = Mop_ManCubeOut( p, iCubeNew );
        pCube1 = Mop_ManCubeOut( p, Vec_IntEntry(vGroup, c1) );
        pCube2 = Mop_ManCubeOut( p, Vec_IntEntry(vGroup, c2) );

        assert( !memcmp(pCube1, pCube2, sizeof(word)*p->nWordsOut) );
        for ( w = 0; w < p->nWordsOut; w++ )
            pCube[w] = pCube1[w];

        Vec_IntPush( vGroupPrev, iCubeNew );
    }
//    Vec_IntForEachEntry( vPairsNew, c1, i )
    Vec_IntForEachEntry( vToFree, c1, i )
    {
        if ( Vec_IntEntry(vGroup, c1) == -1 )
            continue;
        Vec_IntPush( p->vFree, Vec_IntEntry(vGroup, c1) );
        Vec_IntWriteEntry( vGroup, c1, -1 );
    }
    Vec_IntFree( vToFree );
    if ( Vec_IntSize(vPairsNew) > 0 )
        Map_ManGroupCompact( vGroup );
    Vec_IntFree( vPairs );
    Vec_IntFree( vPairsNew );
    return nCubes - Vec_IntSize(vGroup) - Vec_IntSize(vGroupPrev);
}